

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::reportIfCannotBeNull
          (CheckerVisitor *this,Expr *checkee,Expr *n,char *loc)

{
  int iVar1;
  uint uVar2;
  Expr *pEVar4;
  Expr *pEVar5;
  int32_t dummy;
  int32_t dummy_1;
  int32_t dummy_2;
  int32_t local_3c;
  int32_t local_38;
  int32_t local_34;
  ulong uVar3;
  
  if ((checkee->super_Node)._op == TO_NULLC) {
    local_3c = -1;
    checkee = maybeEval(this,*(Expr **)&checkee[1].super_Node._coordinates,&local_3c,false);
  }
  uVar2 = (checkee->super_Node)._op - TO_OR;
  uVar3 = (ulong)uVar2;
  if (0x2d < uVar2) {
    return;
  }
  if ((0xf87c0dffffU >> (uVar3 & 0x3f) & 1) == 0) {
    if (uVar3 == 0x22) {
      iVar1 = *(int *)&(checkee->super_Node).field_0x1c;
    }
    else {
      if (uVar3 != 0x2d) {
        return;
      }
      local_38 = -1;
      pEVar4 = maybeEval(this,*(Expr **)&checkee[1].super_Node._coordinates,&local_38,false);
      local_34 = -1;
      pEVar5 = maybeEval(this,*(Expr **)&checkee[1].super_Node._coordinates.lineEnd,&local_34,false)
      ;
      uVar3 = (ulong)(pEVar4->super_Node)._op;
      if (0x3e < uVar3) {
        return;
      }
      if ((0x7c3e06ffff800000U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 != 0x39) {
          return;
        }
        if (*(int *)&(pEVar4->super_Node).field_0x1c == 4) {
          return;
        }
      }
      uVar3 = (ulong)(pEVar5->super_Node)._op;
      if (0x3e < uVar3) {
        return;
      }
      if ((0x7c3e06ffff800000U >> (uVar3 & 0x3f) & 1) != 0) goto LAB_00151236;
      if (uVar3 != 0x39) {
        return;
      }
      iVar1 = *(int *)&(pEVar5->super_Node).field_0x1c;
    }
    if (iVar1 == 4) {
      return;
    }
  }
LAB_00151236:
  report(this,&n->super_Node,0x7a,loc);
  return;
}

Assistant:

void CheckerVisitor::reportIfCannotBeNull(const Expr *checkee, const Expr *n, const char *loc) {
  assert(n);

  if (checkee->op() == TO_NULLC) {
    checkee = maybeEval(static_cast<const BinExpr *>(checkee)->rhs());
  }

  if (checkee->op() == TO_TERNARY) {
    const TerExpr *ter = static_cast<const TerExpr *>(checkee);
    const Expr *ifTrue = maybeEval(ter->b());
    const Expr *ifFalse = maybeEval(ter->c());

    if (cannotBeNull(ifTrue) && cannotBeNull(ifFalse)) {
      report(n, DiagnosticsId::DI_EXPR_NOT_NULL, loc);
    }
    return;
  }

  if (cannotBeNull(checkee))
    report(n, DiagnosticsId::DI_EXPR_NOT_NULL, loc);
}